

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_posix::collator<char>::collator
          (collator<char> *this,shared_ptr<__locale_struct_*> *l,size_t refs)

{
  std::__cxx11::collate<char>::collate((ulong)this);
  *(undefined ***)this = &PTR__collator_001db608;
  std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>,
             &l->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

collator(booster::shared_ptr<locale_t> l,size_t refs = 0) : 
        std::collate<CharType>(refs),
        lc_(l)
    {
    }